

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O0

void __thiscall
ConfidentialTxOut_DefaultConstractor_Test::ConfidentialTxOut_DefaultConstractor_Test
          (ConfidentialTxOut_DefaultConstractor_Test *this)

{
  ConfidentialTxOut_DefaultConstractor_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ConfidentialTxOut_DefaultConstractor_Test_009eee30;
  return;
}

Assistant:

TEST(ConfidentialTxOut, DefaultConstractor) {
  // default constructor
  ConfidentialTxOut txout;
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);

  ConfidentialTxOutReference txout_ref(txout);
  EXPECT_STREQ(txout_ref.GetAsset().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(), 0);
}